

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

void gen_move_insn_before(gen_ctx_t gen_ctx,MIR_insn_t before,MIR_insn_t insn)

{
  bb_insn_t_conflict elem;
  MIR_insn_t pMVar1;
  bb_insn_t_conflict before_00;
  MIR_insn_t pMVar2;
  int iVar3;
  MIR_func_t bb_insn;
  
  elem = (bb_insn_t_conflict)insn->data;
  pMVar1 = (insn->insn_link).prev;
  before_00 = (bb_insn_t_conflict)before->data;
  bb_insn = (gen_ctx->curr_func_item->u).func;
  if (pMVar1 == (MIR_insn_t)0x0) {
    if ((bb_insn->insns).head != insn) {
      gen_move_insn_before_cold_1();
      goto LAB_0016b4c8;
    }
    (bb_insn->insns).head = (insn->insn_link).next;
  }
  else {
    (pMVar1->insn_link).next = (insn->insn_link).next;
  }
  pMVar2 = (insn->insn_link).next;
  if (pMVar2 == (MIR_insn_t)0x0) {
    if (((DLIST_LINK_bb_insn_t *)&(bb_insn->insns).tail)->prev != (bb_insn_t)insn) {
LAB_0016b4c8:
      gen_move_insn_before_cold_2();
      iVar3 = ssa_dead_insn_p(gen_ctx,(bb_insn_t_conflict)bb_insn);
      if (iVar3 != 0) {
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          fwrite("  deleting now dead insn ",0x19,1,(FILE *)gen_ctx->debug_file);
          print_bb_insn(gen_ctx,(bb_insn_t_conflict)bb_insn,0);
        }
        pMVar1 = (MIR_insn_t)bb_insn->name;
        remove_insn_ssa_edges(pMVar1);
        gen_delete_insn(gen_ctx,pMVar1);
      }
      return;
    }
    pMVar2 = (MIR_insn_t)&bb_insn->insns;
  }
  (pMVar2->insn_link).prev = pMVar1;
  (insn->insn_link).prev = (MIR_insn_t)0x0;
  (insn->insn_link).next = (MIR_insn_t)0x0;
  MIR_insert_insn_before(gen_ctx->ctx,gen_ctx->curr_func_item,before,insn);
  DLIST_bb_insn_t_remove(&elem->bb->bb_insns,elem);
  DLIST_bb_insn_t_insert_before(&before_00->bb->bb_insns,before_00,elem);
  elem->bb = before_00->bb;
  return;
}

Assistant:

static void gen_move_insn_before (gen_ctx_t gen_ctx, MIR_insn_t before, MIR_insn_t insn) {
  bb_insn_t bb_insn = insn->data, before_bb_insn = before->data;

  DLIST_REMOVE (MIR_insn_t, curr_func_item->u.func->insns, insn);
  MIR_insert_insn_before (gen_ctx->ctx, curr_func_item, before, insn);
  DLIST_REMOVE (bb_insn_t, bb_insn->bb->bb_insns, bb_insn);
  DLIST_INSERT_BEFORE (bb_insn_t, before_bb_insn->bb->bb_insns, before_bb_insn, bb_insn);
  bb_insn->bb = before_bb_insn->bb;
}